

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.cpp
# Opt level: O2

string * __thiscall
booster::aio::endpoint::ip_abi_cxx11_(string *__return_storage_ptr__,endpoint *this)

{
  socklen_t __len;
  family_type fVar1;
  char *pcVar2;
  void *__cp;
  endpoint *this_00;
  allocator local_49;
  char buf [17];
  
  this_00 = this;
  fVar1 = family(this);
  if (fVar1 == pf_inet6) {
    stack0xffffffffffffffc8 = 0;
    __cp = (void *)((long)&((this->d).ptr_)->sa + 8);
    this_00 = (endpoint *)0xa;
    __len = 0x2f;
  }
  else {
    if (fVar1 != pf_inet) goto LAB_0017309d;
    stack0xffffffffffffffc8 = stack0xffffffffffffffc8 & 0xffffffffffffff00;
    __cp = (void *)((long)&((this->d).ptr_)->sa + 4);
    this_00 = (endpoint *)0x2;
    __len = 0x11;
  }
  buf[8] = '\0';
  buf[9] = '\0';
  buf[10] = '\0';
  buf[0xb] = '\0';
  buf[0xc] = '\0';
  buf[0xd] = '\0';
  buf[0xe] = '\0';
  buf[0xf] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  pcVar2 = inet_ntop((int)this_00,__cp,buf,__len);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_49);
    return __return_storage_ptr__;
  }
LAB_0017309d:
  throw_invalid(this_00);
}

Assistant:

std::string endpoint::ip() const
{
	switch(family()) {
	case pf_inet:
		{
#ifndef BOOSTER_WIN32
			char buf[INET_ADDRSTRLEN+1] = {0};
			char const *res = ::inet_ntop(AF_INET,&d->sa.in.sin_addr,buf,sizeof(buf));
			if(res)
				return std::string(res);
			throw_invalid();
#else
			std::ostringstream tmp;
			tmp.imbue(std::locale::classic());
			unsigned char const *p = reinterpret_cast<unsigned char const *>(&d->sa.in.sin_addr);
			tmp << int(p[0]) <<"." << int(p[1]) <<"."<<int(p[2]) <<"." << int(p[3]);
			return tmp.str();
#endif
		}
		break;
#ifndef BOOSTER_AIO_NO_PF_INET6
	case pf_inet6:
		{
			char buf[INET6_ADDRSTRLEN+1] = {0};
            #ifndef BOOSTER_WIN32
			char const *res = ::inet_ntop(AF_INET6,&d->sa.in6.sin6_addr,buf,sizeof(buf));
            #else
            struct in6_addr addr = d->sa.in6.sin6_addr; 
            // under windows it isn't const function
            char const *res = ::inet_ntop(AF_INET6,&addr,buf,sizeof(buf));
            #endif
			if(res)
				return std::string(res);
			throw_invalid();
		}
		break;
#endif
	default:
		throw_invalid();
	}
	return std::string(); // shut gcc up
}